

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.h
# Opt level: O2

bool is_prefix(string *prefix,string *base)

{
  pointer pcVar1;
  pair<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar2;
  
  if (base->_M_string_length < prefix->_M_string_length) {
    return false;
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  pVar2 = std::
          __mismatch<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (pcVar1,pcVar1 + prefix->_M_string_length,(base->_M_dataplus)._M_p);
  return pVar2.first._M_current._M_current == (prefix->_M_dataplus)._M_p + prefix->_M_string_length;
}

Assistant:

inline static bool is_prefix(std::string prefix, std::string base) {
	if (prefix.size() > base.size()) return false;

	auto res = mismatch(prefix.begin(), prefix.end(), base.begin());
	if (res.first == prefix.end()) return true;

	return false;
}